

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O3

ostream * GenApi_3_4::operator<<(ostream *os,CFeatureBag *FeatureBag)

{
  int iVar1;
  char cVar2;
  long *plVar3;
  ostream *poVar4;
  gcstring *pgVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  const_iterator end;
  const_iterator it;
  gcstring Value;
  gcstring Name;
  const_iterator local_180 [8];
  const_iterator local_178 [8];
  gcstring local_170 [80];
  gcstring local_120 [80];
  gcstring local_d0 [80];
  gcstring local_80 [80];
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# {05D8C294-F295-4dfb-9D01-096BD04049F4}\n",0x29);
  plVar3 = (long *)GenApi_3_4::CFeatureBag::GetInfo();
  cVar2 = (**(code **)(*plVar3 + 0x50))(plVar3);
  iVar1 = (int)os;
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"# GenApi persistence file (version ",0x23);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
    pgVar5 = (gcstring *)GenApi_3_4::CFeatureBag::GetInfo();
    pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(pgVar5);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  GenApi_3_4::CFeatureBag::GetBegin();
  GenApi_3_4::CFeatureBag::GetEnd();
  cVar2 = GenApi_3_4::CFeatureBag::const_iterator::operator!=(local_178,local_180);
  if (cVar2 != '\0') {
    do {
      pgVar5 = (gcstring *)GenApi_3_4::CFeatureBag::const_iterator::operator->(local_178);
      GenICam_3_4::gcstring::gcstring(local_120,pgVar5);
      lVar8 = GenApi_3_4::CFeatureBag::const_iterator::operator->(local_178);
      GenICam_3_4::gcstring::gcstring(local_170,(gcstring *)(lVar8 + 0x50));
      GenApi_3_4::CFeatureBag::const_iterator::operator->(local_178);
      cVar2 = GenApi_3_4::CSelectorState::IsEmpty();
      if (cVar2 == '\0') {
        pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_120);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\t{",2);
        GenApi_3_4::CFeatureBag::const_iterator::operator->(local_178);
        GenApi_3_4::CSelectorState::SetFirst();
        while( true ) {
          GenApi_3_4::CFeatureBag::const_iterator::operator->(local_178);
          GenApi_3_4::CSelectorState::GetNodeName();
          pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_80);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)os + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"=",1);
          GenApi_3_4::CFeatureBag::const_iterator::operator->(local_178);
          GenApi_3_4::CSelectorState::GetNodeValue();
          pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_d0);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)os + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar7);
          }
          GenICam_3_4::gcstring::~gcstring(local_d0);
          GenICam_3_4::gcstring::~gcstring(local_80);
          GenApi_3_4::CFeatureBag::const_iterator::operator->(local_178);
          cVar2 = GenApi_3_4::CSelectorState::SetNext();
          if (cVar2 == '\0') break;
          std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"}\t",2);
        pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_170);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      else {
        pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_120);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
        pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_170);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      GenICam_3_4::gcstring::~gcstring(local_170);
      GenICam_3_4::gcstring::~gcstring(local_120);
      GenApi_3_4::CFeatureBag::const_iterator::operator++(local_178);
      cVar2 = GenApi_3_4::CFeatureBag::const_iterator::operator!=(local_178,local_180);
    } while (cVar2 != '\0');
  }
  return os;
}

Assistant:

inline std::ostream& operator <<(std::ostream &os, const CFeatureBag &FeatureBag)
    {
        os << "# " GENAPI_PERSISTENCE_MAGIC "\n";
        if( !FeatureBag.GetInfo().empty() )
        {
            os << "# GenApi persistence file (version " << GENAPI_VERSION_MAJOR << "." << GENAPI_VERSION_MINOR << "." << GENAPI_VERSION_SUBMINOR << ")\n";
            os << "# " << FeatureBag.GetInfo() << "\n";
        }
        for (
            CFeatureBag::const_iterator it = FeatureBag.GetBegin(), end = FeatureBag.GetEnd();
            it != end;
            ++it
            )
        {
            const GENICAM_NAMESPACE::gcstring Name(it->name);
            const GENICAM_NAMESPACE::gcstring Value(it->value);
            if ((it->pState)->IsEmpty())
            {
                os << Name << "\t" << Value << "\n";
            }
            else
            {
                bool isFirst = true;
                os << Name << "\t{";
                (it->pState)->SetFirst();
                do
                {
                    if (!isFirst)
                        os << "\t";
                    else
                        isFirst = false;
                    os << (it->pState)->GetNodeName() << "=" << (it->pState)->GetNodeValue();
                } while ((it->pState)->SetNext());
                os << "}\t" << Value << "\n";
            }
        }

        return os;
    }